

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O2

void HTS_Model_add_parameter
               (HTS_Model *model,size_t state_index,char *string,double *mean,double *vari,
               double *msd,double weight)

{
  float *pfVar1;
  long lVar2;
  long lVar3;
  size_t pdf_index;
  size_t tree_index;
  size_t local_40;
  size_t local_38;
  
  lVar2 = model->num_windows * model->vector_length;
  HTS_Model_get_index(model,state_index,string,&local_38,&local_40);
  for (lVar3 = 0; lVar2 - lVar3 != 0; lVar3 = lVar3 + 1) {
    pfVar1 = model->pdf[local_38][local_40];
    mean[lVar3] = (double)pfVar1[lVar3] * weight + mean[lVar3];
    vari[lVar3] = (double)pfVar1[lVar3 + lVar2] * weight + vari[lVar3];
  }
  if ((msd != (double *)0x0) && (model->is_msd == '\x01')) {
    *msd = weight * (double)model->pdf[local_38][local_40][lVar2 * 2] + *msd;
  }
  return;
}

Assistant:

static void HTS_Model_add_parameter(HTS_Model * model, size_t state_index, const char *string, double *mean, double *vari, double *msd, double weight)
{
   size_t i;
   size_t tree_index, pdf_index;
   size_t len = model->vector_length * model->num_windows;

   HTS_Model_get_index(model, state_index, string, &tree_index, &pdf_index);
   for (i = 0; i < len; i++) {
      mean[i] += weight * model->pdf[tree_index][pdf_index][i];
      vari[i] += weight * model->pdf[tree_index][pdf_index][i + len];
   }
   if (msd != NULL && model->is_msd == TRUE)
      *msd += weight * model->pdf[tree_index][pdf_index][len + len];
}